

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O1

void densePOTRS(realtype **a,sunindextype m,realtype *b)

{
  realtype *prVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  realtype rVar7;
  
  if (1 < m) {
    lVar3 = 0;
    do {
      prVar1 = a[lVar3];
      b[lVar3] = b[lVar3] / prVar1[lVar3];
      lVar4 = lVar3 + 1;
      lVar5 = lVar4;
      do {
        b[lVar5] = b[lVar5] - b[lVar3] * prVar1[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 < m);
      lVar3 = lVar4;
    } while (lVar4 != m + -1);
  }
  prVar1 = a[m + -1];
  dVar6 = b[m + -1] / prVar1[m + -1];
  b[m + -1] = dVar6;
  b[m + -1] = dVar6 / prVar1[m + -1];
  if (1 < m) {
    lVar5 = -1;
    lVar3 = m + -2;
    do {
      prVar1 = a[lVar3];
      if (lVar3 + 1 < m) {
        rVar7 = b[lVar3];
        lVar4 = lVar5;
        do {
          rVar7 = rVar7 - prVar1[m + lVar4] * b[m + lVar4];
          b[lVar3] = rVar7;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0);
      }
      b[lVar3] = b[lVar3] / prVar1[lVar3];
      lVar5 = lVar5 + -1;
      bVar2 = 0 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void densePOTRS(realtype **a, sunindextype m, realtype *b)
{
  realtype *col_j, *col_i;
  sunindextype i, j;

  /* Solve C y = b, forward substitution - column version.
     Store solution y in b */
  for (j=0; j < m-1; j++) {
    col_j = a[j];
    b[j] /= col_j[j];
    for (i=j+1; i < m; i++)
      b[i] -= b[j]*col_j[i];
  }
  col_j = a[m-1];
  b[m-1] /= col_j[m-1];

  /* Solve C^T x = y, backward substitution - row version.
     Store solution x in b */
  col_j = a[m-1];
  b[m-1] /= col_j[m-1];
  for (i=m-2; i>=0; i--) {
    col_i = a[i];
    for (j=i+1; j<m; j++) 
      b[i] -= col_i[j]*b[j];
    b[i] /= col_i[i];
  }

}